

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O2

_Bool check_for_unreserved_blocks(wchar_t by1,wchar_t bx1,wchar_t by2,wchar_t bx2)

{
  _Bool *p_Var1;
  ulong uVar2;
  ulong uVar3;
  
  if ((((L'\xffffffff' < by1) && (L'\xffffffff' < bx1)) && (by2 < dun->row_blocks)) &&
     (bx2 < dun->col_blocks)) {
    uVar2 = (ulong)(uint)by1;
    do {
      uVar3 = (ulong)(uint)bx1;
      if (by2 < (wchar_t)uVar2) {
        return true;
      }
      while ((wchar_t)uVar3 <= bx2) {
        p_Var1 = dun->room_map[uVar2] + uVar3;
        uVar3 = uVar3 + 1;
        if (*p_Var1 != false) {
          return false;
        }
      }
      uVar2 = uVar2 + 1;
    } while( true );
  }
  return false;
}

Assistant:

static bool check_for_unreserved_blocks(int by1, int bx1, int by2, int bx2)
{
	int by, bx;

	/* Never run off the screen */
	if (by1 < 0 || by2 >= dun->row_blocks) return false;
	if (bx1 < 0 || bx2 >= dun->col_blocks) return false;

	/* Verify open space */
	for (by = by1; by <= by2; by++) {
		for (bx = bx1; bx <= bx2; bx++) {
			if (dun->room_map[by][bx]) return false;
		}
	}
	return true;
}